

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_gga_inc.c
# Opt level: O1

void work_gga_fxc_pol(xc_func_type *p,size_t np,double *rho,double *sigma,xc_gga_out_params *out)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  undefined1 auVar146 [16];
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  undefined1 auVar147 [16];
  double dVar151;
  double dVar152;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  double __x;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  undefined1 auVar172 [16];
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  double dVar179;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  undefined1 auVar223 [16];
  double dVar239;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  double dVar246;
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  double dVar251;
  double dVar252;
  double dVar257;
  undefined1 auVar253 [16];
  double dVar258;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  double dVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  double dVar263;
  double dVar264;
  double dVar265;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  double dVar275;
  double dVar276;
  double dVar277;
  double dVar278;
  double dVar279;
  double dVar280;
  double dVar281;
  double dVar282;
  undefined1 auVar283 [16];
  double dVar296;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  double dVar297;
  double dVar298;
  double dVar299;
  double dVar300;
  double dVar301;
  double dVar302;
  double dVar303;
  double dVar304;
  double dVar305;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  double dVar316;
  double dVar317;
  double dVar318;
  double dVar319;
  double dVar320;
  double dVar321;
  double dVar322;
  double dVar323;
  double dVar324;
  double dVar325;
  double dVar326;
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  double dVar331;
  double dVar332;
  double dVar333;
  double dVar334;
  double dVar335;
  double dVar336;
  double dVar337;
  double dVar338;
  double dVar339;
  double dVar340;
  double dVar341;
  undefined1 auVar342 [16];
  double dVar343;
  double dVar344;
  double dVar345;
  double dVar346;
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  double dVar353;
  double dVar354;
  double dVar355;
  double dVar356;
  double dVar357;
  double dVar358;
  double dVar359;
  double dVar362;
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  double dVar363;
  double dVar364;
  double dVar365;
  double dVar366;
  double dVar367;
  double dVar368;
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  double dVar372;
  undefined1 auVar371 [16];
  double dVar373;
  double dVar374;
  double dVar375;
  double dVar376;
  double local_d18;
  double local_bb0;
  double local_8a8;
  double local_6b8;
  double dStack_6b0;
  double local_668;
  double local_618;
  double local_608;
  double local_568;
  double dStack_560;
  double local_408;
  double local_3f8;
  
  if (np != 0) {
    sVar10 = 0;
    local_bb0 = 0.0;
    local_d18 = 0.0;
    do {
      if (p->nspin == 2) {
        lVar8 = (long)(p->dim).rho * sVar10;
        dVar18 = rho[lVar8] + rho[lVar8 + 1];
      }
      else {
        dVar18 = rho[(long)(p->dim).rho * sVar10];
      }
      dVar66 = p->dens_threshold;
      if (dVar66 <= dVar18) {
        lVar8 = (long)(p->dim).rho * sVar10;
        lVar9 = (long)(p->dim).sigma * sVar10;
        dVar18 = rho[lVar8];
        if (rho[lVar8] <= dVar66) {
          dVar18 = dVar66;
        }
        dVar19 = p->sigma_threshold * p->sigma_threshold;
        dVar171 = sigma[lVar9];
        if (sigma[lVar9] <= dVar19) {
          dVar171 = dVar19;
        }
        if (p->nspin == 2) {
          local_d18 = rho[lVar8 + 1];
          if (rho[lVar8 + 1] <= dVar66) {
            local_d18 = dVar66;
          }
          local_bb0 = sigma[lVar9 + 2];
          if (sigma[lVar9 + 2] <= dVar19) {
            local_bb0 = dVar19;
          }
        }
        pdVar2 = (double *)p->params;
        __x = dVar18 + local_d18;
        dVar122 = 1.0 / __x;
        dVar209 = (dVar18 + dVar18) * dVar122;
        dVar19 = p->zeta_threshold;
        dVar153 = dVar19 + -1.0;
        dVar240 = (local_d18 + local_d18) * dVar122;
        dVar20 = dVar18 - local_d18;
        uVar11 = -(ulong)(dVar240 <= dVar19);
        uVar12 = -(ulong)(dVar209 <= dVar19);
        dVar59 = (double)(uVar12 & (ulong)dVar153 |
                         ~uVar12 & (~uVar11 & (ulong)(dVar20 * dVar122) | (ulong)-dVar153 & uVar11))
        ;
        dVar85 = dVar59 + 1.0;
        dVar21 = cbrt(dVar19);
        dVar22 = cbrt(dVar85);
        uVar13 = -(ulong)(dVar85 <= dVar19);
        dVar23 = (double)(uVar13 & (ulong)(dVar21 * dVar19) | ~uVar13 & (ulong)(dVar22 * dVar85)) *
                 0.9847450218426964;
        dVar24 = cbrt(__x);
        dVar86 = pdVar2[2] * dVar171;
        dVar87 = dVar18 * dVar18;
        dVar25 = cbrt(dVar18);
        dVar123 = 1.0 / dVar25;
        dVar88 = 1.0 / (dVar25 * dVar25);
        dVar89 = dVar88 / dVar87;
        dVar154 = pdVar2[3] * dVar171 * dVar171;
        dVar180 = dVar87 * dVar87;
        dVar124 = dVar123 / (dVar18 * dVar180);
        dVar125 = dVar86 * dVar89 + dVar154 * dVar124 + 1.0;
        dVar25 = (-1.0 / dVar125 + 1.0) * pdVar2[1];
        dVar126 = pdVar2[4] * dVar171;
        dVar127 = dVar126 * dVar89 + 1.0;
        dVar90 = -1.0 / dVar127 + 1.0;
        dVar26 = dVar25 * dVar90 + *pdVar2;
        dVar27 = cbrt(0.3183098861837907);
        dVar91 = 1.0 / dVar27;
        dVar92 = dVar91 * 1.5874010519681996 * 6.534776057350833;
        dVar93 = dVar92 / dVar26;
        if (dVar93 < 0.0) {
          dVar28 = sqrt(dVar93);
        }
        else {
          dVar28 = SQRT(dVar93);
        }
        dVar94 = p->cam_omega / dVar28;
        dVar29 = cbrt(__x * dVar85);
        dVar29 = 1.0 / dVar29;
        dVar30 = dVar29 * 1.2599210498948732;
        dVar155 = dVar94 * dVar30 * 0.5;
        dVar181 = 1.35;
        if (dVar155 <= 1.35) {
          dVar181 = dVar155;
        }
        dVar31 = 1.0 / dVar181;
        dVar32 = erf(dVar31 * 0.5);
        dVar95 = dVar181 * dVar181;
        dVar33 = 1.0 / dVar95;
        dVar34 = exp(dVar33 * -0.25);
        dVar52 = dVar155;
        if (dVar155 <= 1.35) {
          dVar52 = 1.35;
        }
        dVar316 = dVar52 * dVar52;
        dVar331 = dVar316 * dVar316;
        dVar259 = 1.0 / (dVar316 * dVar331);
        dVar96 = dVar331 * dVar331;
        auVar283._0_8_ = dVar96 * dVar96;
        auVar283._8_8_ = dVar96;
        auVar283 = divpd(_DAT_01041040,auVar283);
        dVar275 = auVar283._0_8_;
        dVar296 = auVar283._8_8_;
        auVar306._8_8_ = dVar331;
        auVar306._0_8_ = dVar316;
        auVar67._8_8_ = dVar296;
        auVar67._0_8_ = dVar296;
        auVar306 = divpd(auVar67,auVar306);
        dVar241 = dVar296 / (dVar316 * dVar331);
        dVar97 = dVar34 + -1.0;
        dVar128 = dVar95 * -2.0 * dVar97 + dVar34 + -1.5;
        dVar96 = dVar181 + dVar181;
        dVar32 = dVar96 * dVar128 + dVar32 * 1.7724538509055159;
        dVar129 = 1.0 / dVar331;
        if (dVar155 < 1.35) {
          dVar35 = dVar181 * -2.6666666666666665 * dVar32 + 1.0;
        }
        else {
          auVar117._0_8_ = 1.0 / dVar316;
          auVar117._8_8_ = dVar129;
          auVar67 = divpd(auVar117,_DAT_0104f970);
          auVar146._8_8_ = dVar296;
          auVar146._0_8_ = dVar259;
          auVar117 = divpd(auVar146,_DAT_0104f980);
          auVar146 = divpd(auVar306,_DAT_0104f990);
          auVar172._8_8_ = dVar275;
          auVar172._0_8_ = dVar241;
          auVar172 = divpd(auVar172,_DAT_0104f9a0);
          dVar35 = ((((((auVar67._0_8_ - auVar67._8_8_) + auVar117._0_8_) - auVar117._8_8_) +
                     auVar146._0_8_) - auVar146._8_8_) + auVar172._0_8_) - auVar172._8_8_;
        }
        dVar40 = p->cam_beta;
        dVar41 = p->cam_alpha;
        dVar36 = dVar23 * -0.375;
        dVar1 = p->dens_threshold;
        dVar130 = -dVar20;
        dVar220 = (double)((ulong)dVar153 & uVar11 |
                          ~uVar11 & ((ulong)-dVar153 & uVar12 | ~uVar12 & (ulong)(dVar122 * dVar130)
                                    ));
        dVar98 = dVar220 + 1.0;
        dVar153 = p->zeta_threshold;
        dVar37 = cbrt(dVar98);
        uVar14 = -(ulong)(dVar98 <= dVar153);
        dVar21 = (double)((ulong)(dVar21 * dVar19) & uVar14 | ~uVar14 & (ulong)(dVar98 * dVar37)) *
                 0.9847450218426964;
        dVar99 = pdVar2[2] * local_bb0;
        dVar100 = local_d18 * local_d18;
        dVar38 = cbrt(local_d18);
        dVar156 = 1.0 / dVar38;
        dVar131 = 1.0 / (dVar38 * dVar38);
        dVar132 = dVar131 / dVar100;
        dVar182 = pdVar2[3] * local_bb0 * local_bb0;
        dVar210 = dVar100 * dVar100;
        dVar157 = dVar156 / (local_d18 * dVar210);
        dVar158 = dVar99 * dVar132 + dVar182 * dVar157 + 1.0;
        dVar159 = (1.0 - 1.0 / dVar158) * pdVar2[1];
        dVar38 = pdVar2[4] * local_bb0;
        dVar183 = dVar38 * dVar132 + 1.0;
        dVar133 = 1.0 - 1.0 / dVar183;
        dVar160 = dVar159 * dVar133 + *pdVar2;
        dVar92 = dVar92 / dVar160;
        if (dVar92 < 0.0) {
          dVar134 = sqrt(dVar92);
        }
        else {
          dVar134 = SQRT(dVar92);
        }
        dVar39 = dVar24 * dVar26;
        dVar40 = (-dVar40 * dVar35 - dVar41) + 1.0;
        dVar41 = p->cam_omega / dVar134;
        dVar42 = cbrt(__x * dVar98);
        dVar42 = 1.0 / dVar42;
        dVar43 = dVar42 * 1.2599210498948732;
        dVar135 = dVar41 * dVar43 * 0.5;
        dVar35 = 1.35;
        if (dVar135 <= 1.35) {
          dVar35 = dVar135;
        }
        dVar44 = 1.0 / dVar35;
        dVar45 = erf(dVar44 * 0.5);
        dVar101 = dVar35 * dVar35;
        dVar46 = 1.0 / dVar101;
        dVar47 = exp(dVar46 * -0.25);
        dVar55 = dVar135;
        if (dVar135 <= 1.35) {
          dVar55 = 1.35;
        }
        dVar260 = dVar55 * dVar55;
        dVar297 = dVar260 * dVar260;
        dVar332 = 1.0 / (dVar260 * dVar297);
        dVar102 = dVar297 * dVar297;
        auVar174._0_8_ = dVar102 * dVar102;
        auVar174._8_8_ = dVar102;
        auVar67 = divpd(_DAT_01041040,auVar174);
        dVar242 = auVar67._0_8_;
        dVar257 = auVar67._8_8_;
        auVar147._8_8_ = dVar297;
        auVar147._0_8_ = dVar260;
        auVar347._8_8_ = dVar257;
        auVar347._0_8_ = dVar257;
        auVar117 = divpd(auVar347,auVar147);
        dVar184 = dVar257 / (dVar260 * dVar297);
        dVar161 = dVar47 + -1.0;
        dVar136 = dVar101 * -2.0 * dVar161 + dVar47 + -1.5;
        dVar102 = dVar35 + dVar35;
        dVar45 = dVar45 * 1.7724538509055159 + dVar102 * dVar136;
        dVar137 = 1.0 / dVar297;
        if (dVar135 < 1.35) {
          dVar48 = dVar35 * -2.6666666666666665 * dVar45 + 1.0;
        }
        else {
          auVar68._0_8_ = 1.0 / dVar260;
          auVar68._8_8_ = dVar137;
          auVar146 = divpd(auVar68,_DAT_0104f970);
          auVar118._8_8_ = dVar257;
          auVar118._0_8_ = dVar332;
          auVar172 = divpd(auVar118,_DAT_0104f980);
          auVar147 = divpd(auVar117,_DAT_0104f990);
          auVar173._8_8_ = dVar242;
          auVar173._0_8_ = dVar184;
          auVar174 = divpd(auVar173,_DAT_0104f9a0);
          dVar48 = ((((((auVar146._0_8_ - auVar146._8_8_) + auVar172._0_8_) - auVar172._8_8_) +
                     auVar147._0_8_) - auVar147._8_8_) + auVar174._0_8_) - auVar174._8_8_;
        }
        dVar162 = dVar39 * dVar40;
        uVar15 = -(ulong)(dVar18 <= dVar66);
        dVar103 = dVar24 * dVar160;
        dVar163 = (-p->cam_beta * dVar48 - p->cam_alpha) + 1.0;
        dVar104 = dVar103 * dVar163;
        dVar48 = dVar21 * -0.375;
        uVar16 = -(ulong)(local_d18 <= dVar1);
        dVar105 = (double)(~uVar16 & (ulong)(dVar48 * dVar104)) +
                  (double)(~uVar15 & (ulong)(dVar36 * dVar162));
        pdVar3 = out->zk;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar8 = (long)(p->dim).zk * sVar10;
          pdVar3[lVar8] = pdVar3[lVar8] + dVar105;
        }
        dVar106 = __x * __x;
        dVar49 = 1.0 / dVar106;
        bVar4 = dVar19 < dVar240;
        bVar5 = dVar19 < dVar209;
        local_8a8 = 0.0;
        dVar343 = 0.0;
        if (bVar5 && bVar4) {
          dVar343 = dVar122 - dVar20 * dVar49;
        }
        dVar333 = 1.0 / (dVar24 * dVar24);
        dVar276 = pdVar2[1] / (dVar125 * dVar125);
        dVar243 = dVar88 / (dVar18 * dVar87);
        dVar107 = dVar123 / (dVar87 * dVar180);
        dVar164 = dVar86 * -2.6666666666666665 * dVar243 + dVar154 * -5.333333333333333 * dVar107;
        dVar108 = 1.0 / (dVar127 * dVar127);
        dVar165 = dVar164 * dVar90 * dVar276 +
                  dVar108 * dVar25 * -2.6666666666666665 * dVar126 * dVar243;
        auVar284._0_8_ = dVar331 * dVar52;
        auVar284._8_8_ = dVar316 * dVar52;
        dVar93 = (p->cam_omega / dVar28) / dVar93;
        dVar138 = dVar30 * dVar93 * 3.141592653589793;
        dVar50 = dVar91 * 2.080083823051904;
        dVar185 = dVar26 * dVar26;
        dVar109 = 1.0 / dVar185;
        dVar110 = dVar109 * 1.5874010519681996;
        dVar244 = (dVar29 / (__x * dVar85)) * 1.2599210498948732;
        dVar344 = dVar343 * __x + dVar59 + 1.0;
        dVar51 = dVar50 * dVar138;
        dVar345 = (dVar344 * dVar94 * dVar244) / -6.0 + dVar110 * dVar165 * dVar51 * 0.25;
        auVar175._8_8_ = dVar331 * auVar284._8_8_;
        auVar175._0_8_ = dVar52;
        dVar261 = dVar22 * 1.3333333333333333;
        dVar334 = dVar333 * dVar26;
        dVar52 = dVar334 * dVar40;
        dVar335 = dVar23 * dVar52 * 0.125;
        uVar17 = -(ulong)(1.35 < dVar155);
        dVar331 = (double)(uVar17 & (ulong)dVar345);
        auVar223._8_8_ = 0x3ff0000000000000;
        auVar223._0_8_ = dVar296;
        if (dVar155 <= 1.35) {
          local_8a8 = dVar345;
        }
        dVar245 = 1.0 / auVar284._8_8_;
        dVar345 = 1.0 / auVar284._0_8_;
        auVar146 = divpd(auVar223,auVar175);
        auVar6._8_8_ = dVar296;
        auVar6._0_8_ = dVar296;
        auVar172 = divpd(auVar6,auVar284);
        auVar283 = divpd(auVar283,auVar175);
        dVar277 = 1.0 / (dVar181 * dVar95);
        dVar211 = auVar146._0_8_;
        dVar239 = auVar146._8_8_;
        dVar212 = dVar97 * dVar181 * -4.0;
        dVar213 = (dVar212 * local_8a8 + dVar277 * local_8a8 * dVar34 * 0.5) -
                  local_8a8 * dVar31 * dVar34;
        dVar111 = local_8a8 + local_8a8;
        dVar363 = -dVar34 * dVar33;
        dVar364 = dVar363 * local_8a8 + dVar96 * dVar213 + dVar128 * dVar111;
        dVar362 = auVar172._8_8_;
        dVar151 = auVar283._8_8_;
        dVar353 = auVar172._0_8_;
        dVar139 = auVar283._0_8_;
        if (dVar155 < 1.35) {
          dVar246 = dVar181 * -2.6666666666666665 * dVar364 +
                    local_8a8 * -2.6666666666666665 * dVar32;
        }
        else {
          auVar198._0_8_ = -dVar245 * dVar331;
          auVar198._8_8_ = dVar345 * dVar331;
          auVar146 = divpd(auVar198,_DAT_0104f9b0);
          auVar176._0_8_ = dVar211 * dVar331;
          auVar176._8_8_ = dVar239 * dVar331;
          auVar283 = divpd(auVar176,_DAT_0104f9c0);
          auVar348._0_8_ = dVar353 * dVar331;
          auVar348._8_8_ = dVar362 * dVar331;
          auVar147 = divpd(auVar348,_DAT_0104f9d0);
          auVar285._0_8_ = dVar331 * dVar139;
          auVar285._8_8_ = dVar331 * dVar151;
          auVar172 = divpd(auVar285,_DAT_0104f9e0);
          dVar246 = ((((((auVar146._8_8_ + auVar146._0_8_) - auVar283._8_8_) + auVar283._0_8_) -
                      auVar147._8_8_) + auVar147._0_8_) - auVar172._8_8_) + auVar172._0_8_;
        }
        dVar166 = (double)(~uVar13 & (ulong)(dVar261 * dVar343 * 0.9847450218426964));
        dVar167 = dVar24 * dVar165;
        dVar112 = dVar40 * dVar167;
        dVar246 = dVar246 * p->cam_beta;
        dVar113 = dVar39 * dVar246;
        dVar278 = 0.0;
        local_668 = 0.0;
        if (dVar66 < dVar18) {
          local_668 = dVar23 * 0.375 * dVar113 +
                      ((dVar166 * -0.375 * dVar162 - dVar335) - dVar23 * 0.375 * dVar112);
        }
        if (dVar19 < dVar240) {
          dVar278 = (double)(~uVar12 & (ulong)(-dVar122 - dVar49 * dVar130));
        }
        dVar373 = dVar37 * 1.3333333333333333;
        dVar240 = dVar333 * dVar160;
        dVar53 = dVar240 * dVar163;
        dVar262 = dVar21 * dVar53 * 0.125;
        auVar360._0_8_ = dVar297 * dVar55;
        auVar360._8_8_ = dVar260 * dVar55;
        dVar54 = (dVar42 / (__x * dVar98)) * 1.2599210498948732;
        dVar140 = dVar278 * __x + dVar220 + 1.0;
        dVar214 = dVar41 * dVar54;
        dVar215 = (dVar214 * dVar140) / -6.0;
        local_618 = dVar215;
        if (dVar135 <= 1.35) {
          local_618 = 0.0;
        }
        dVar279 = 1.0 / auVar360._8_8_;
        dVar365 = 1.0 / auVar360._0_8_;
        auVar253._8_8_ = 0x3ff0000000000000;
        auVar253._0_8_ = dVar257;
        auVar327._8_8_ = dVar297 * auVar360._8_8_;
        auVar327._0_8_ = dVar55;
        auVar172 = divpd(auVar253,auVar327);
        dVar258 = auVar172._8_8_;
        auVar7._8_8_ = dVar257;
        auVar7._0_8_ = dVar257;
        auVar146 = divpd(auVar7,auVar360);
        auVar283 = divpd(auVar67,auVar327);
        uVar12 = -(ulong)(1.35 < dVar135);
        dVar215 = (double)(~uVar12 & (ulong)dVar215);
        dVar298 = 1.0 / (dVar35 * dVar101);
        dVar216 = dVar161 * dVar35 * -4.0;
        dVar354 = (dVar216 * dVar215 + dVar298 * dVar215 * dVar47 * 0.5) - dVar215 * dVar44 * dVar47
        ;
        dVar217 = dVar215 + dVar215;
        dVar299 = -dVar47 * dVar46;
        dVar355 = dVar215 * dVar299 + dVar102 * dVar354 + dVar136 * dVar217;
        dVar152 = auVar146._8_8_;
        dVar297 = auVar283._8_8_;
        dVar247 = auVar172._0_8_;
        dVar141 = auVar146._0_8_;
        dVar55 = auVar283._0_8_;
        if (dVar135 < 1.35) {
          dVar317 = dVar35 * -2.6666666666666665 * dVar355 + dVar215 * -2.6666666666666665 * dVar45;
        }
        else {
          auVar286._0_8_ = -dVar279 * local_618;
          auVar286._8_8_ = dVar365 * local_618;
          auVar146 = divpd(auVar286,_DAT_0104f9b0);
          auVar254._0_8_ = dVar247 * local_618;
          auVar254._8_8_ = dVar258 * local_618;
          auVar67 = divpd(auVar254,_DAT_0104f9c0);
          auVar148._0_8_ = dVar141 * local_618;
          auVar148._8_8_ = dVar152 * local_618;
          auVar283 = divpd(auVar148,_DAT_0104f9d0);
          auVar307._0_8_ = local_618 * dVar55;
          auVar307._8_8_ = local_618 * dVar297;
          auVar172 = divpd(auVar307,_DAT_0104f9e0);
          dVar317 = ((((((auVar146._8_8_ + auVar146._0_8_) - auVar67._8_8_) + auVar67._0_8_) -
                      auVar283._8_8_) + auVar283._0_8_) - auVar172._8_8_) + auVar172._0_8_;
        }
        dVar56 = (double)(~uVar14 & (ulong)(dVar373 * dVar278 * 0.9847450218426964));
        dVar317 = p->cam_beta * dVar317;
        dVar57 = dVar103 * dVar317;
        dVar114 = 0.0;
        if (dVar1 < local_d18) {
          dVar114 = dVar21 * 0.375 * dVar57 + (dVar56 * -0.375 * dVar104 - dVar262);
        }
        pdVar3 = out->vrho;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar8 = (long)(p->dim).vrho * sVar10;
          pdVar3[lVar8] = __x * (local_668 + dVar114) + dVar105 + pdVar3[lVar8];
        }
        dVar58 = 0.0;
        if (dVar19 < dVar209) {
          dVar58 = (double)(~uVar11 & (ulong)(-dVar122 - dVar20 * dVar49));
        }
        dVar59 = dVar58 * __x + dVar59 + 1.0;
        dVar209 = (dVar94 * dVar244 * dVar59) / -6.0;
        local_608 = dVar209;
        if (dVar155 <= 1.35) {
          local_608 = 0.0;
        }
        dVar31 = -dVar31;
        dVar209 = (double)(~uVar17 & (ulong)dVar209);
        dVar300 = dVar209 * dVar31 * dVar34 + dVar212 * dVar209 + dVar277 * dVar209 * dVar34 * 0.5;
        dVar248 = dVar209 + dVar209;
        dVar249 = dVar96 * dVar300 + dVar128 * dVar248 + dVar363 * dVar209;
        if (dVar155 < 1.35) {
          dVar374 = dVar181 * -2.6666666666666665 * dVar249 + dVar209 * -2.6666666666666665 * dVar32
          ;
        }
        else {
          auVar199._0_8_ = -dVar245 * local_608;
          auVar199._8_8_ = dVar345 * local_608;
          auVar283 = divpd(auVar199,_DAT_0104f9b0);
          auVar224._0_8_ = dVar211 * local_608;
          auVar224._8_8_ = dVar239 * local_608;
          auVar67 = divpd(auVar224,_DAT_0104f9c0);
          auVar361._0_8_ = dVar353 * local_608;
          auVar361._8_8_ = dVar362 * local_608;
          auVar172 = divpd(auVar361,_DAT_0104f9d0);
          auVar308._0_8_ = local_608 * dVar139;
          auVar308._8_8_ = local_608 * dVar151;
          auVar146 = divpd(auVar308,_DAT_0104f9e0);
          dVar374 = ((((((auVar283._8_8_ + auVar283._0_8_) - auVar67._8_8_) + auVar67._0_8_) -
                      auVar172._8_8_) + auVar172._0_8_) - auVar146._8_8_) + auVar146._0_8_;
        }
        dVar186 = (double)(~uVar13 & (ulong)(dVar261 * dVar58 * 0.9847450218426964));
        dVar374 = dVar374 * p->cam_beta;
        dVar168 = dVar39 * dVar374;
        dVar115 = 0.0;
        if (dVar66 < dVar18) {
          dVar115 = dVar23 * 0.375 * dVar168 + (dVar186 * -0.375 * dVar162 - dVar335);
        }
        dVar335 = 0.0;
        if (bVar5 && bVar4) {
          dVar335 = dVar122 - dVar49 * dVar130;
        }
        dVar218 = pdVar2[1] / (dVar158 * dVar158);
        dVar336 = dVar131 / (local_d18 * dVar100);
        dVar301 = dVar156 / (dVar100 * dVar210);
        dVar318 = dVar99 * -2.6666666666666665 * dVar336 + dVar182 * -5.333333333333333 * dVar301;
        dVar319 = 1.0 / (dVar183 * dVar183);
        dVar302 = dVar318 * dVar133 * dVar218 +
                  dVar319 * dVar159 * -2.6666666666666665 * dVar38 * dVar336;
        dVar92 = (p->cam_omega / dVar134) / dVar92;
        dVar187 = dVar43 * dVar92 * 3.141592653589793;
        dVar320 = dVar160 * dVar160;
        dVar219 = 1.0 / dVar320;
        dVar321 = dVar335 * __x + dVar220 + 1.0;
        dVar337 = dVar50 * dVar187;
        dVar220 = dVar219 * 1.5874010519681996 * dVar337;
        dVar303 = (dVar321 * dVar214) / -6.0 + dVar302 * dVar220 * 0.25;
        dVar122 = 0.0;
        if (dVar135 <= 1.35) {
          dVar122 = dVar303;
        }
        dVar44 = -dVar44;
        dVar303 = (double)((ulong)dVar303 & uVar12);
        dVar375 = dVar122 * dVar44 * dVar47 + dVar216 * dVar122 + dVar298 * dVar122 * dVar47 * 0.5;
        dVar221 = dVar122 + dVar122;
        dVar356 = dVar299 * dVar122 + dVar102 * dVar375 + dVar136 * dVar221;
        if (dVar135 < 1.35) {
          dVar338 = dVar35 * -2.6666666666666665 * dVar356 + dVar122 * -2.6666666666666665 * dVar45;
        }
        else {
          auVar200._0_8_ = -dVar279 * dVar303;
          auVar200._8_8_ = dVar365 * dVar303;
          auVar283 = divpd(auVar200,_DAT_0104f9b0);
          auVar225._0_8_ = dVar247 * dVar303;
          auVar225._8_8_ = dVar258 * dVar303;
          auVar67 = divpd(auVar225,_DAT_0104f9c0);
          auVar349._0_8_ = dVar141 * dVar303;
          auVar349._8_8_ = dVar152 * dVar303;
          auVar172 = divpd(auVar349,_DAT_0104f9d0);
          auVar309._0_8_ = dVar303 * dVar55;
          auVar309._8_8_ = dVar303 * dVar297;
          auVar146 = divpd(auVar309,_DAT_0104f9e0);
          dVar338 = ((((((auVar283._8_8_ + auVar283._0_8_) - auVar67._8_8_) + auVar67._0_8_) -
                      auVar172._8_8_) + auVar172._0_8_) - auVar146._8_8_) + auVar146._0_8_;
        }
        dVar188 = (double)(~uVar14 & (ulong)(dVar335 * dVar373 * 0.9847450218426964));
        dVar189 = dVar24 * dVar302;
        dVar304 = dVar163 * dVar189;
        dVar338 = p->cam_beta * dVar338;
        dVar322 = dVar103 * dVar338;
        dVar169 = 0.0;
        if (dVar1 < local_d18) {
          dVar169 = dVar21 * 0.375 * dVar322 +
                    ((dVar188 * -0.375 * dVar104 - dVar262) - dVar21 * 0.375 * dVar304);
        }
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar8 = (long)(p->dim).vrho * sVar10;
          pdVar3[lVar8 + 1] = (dVar115 + dVar169) * __x + dVar105 + pdVar3[lVar8 + 1];
        }
        dVar262 = pdVar2[3] * dVar171;
        dVar263 = pdVar2[2] * dVar89 + (dVar262 + dVar262) * dVar124;
        dVar105 = pdVar2[4] * dVar108;
        dVar89 = dVar89 * dVar105;
        dVar222 = dVar276 * dVar90 * dVar263 + dVar25 * dVar89;
        dVar190 = dVar110 * dVar51;
        dVar191 = dVar190 * dVar222 * 0.25;
        local_408 = dVar191;
        if (dVar155 <= 1.35) {
          local_408 = 0.0;
        }
        dVar191 = (double)(~uVar17 & (ulong)dVar191);
        dVar264 = dVar191 * dVar31 * dVar34 + dVar212 * dVar191 + dVar277 * dVar191 * dVar34 * 0.5;
        dVar60 = dVar191 + dVar191;
        dVar376 = dVar96 * dVar264 + dVar128 * dVar60 + dVar363 * dVar191;
        if (dVar155 < 1.35) {
          dVar339 = dVar181 * -2.6666666666666665 * dVar376 + dVar191 * -2.6666666666666665 * dVar32
          ;
        }
        else {
          auVar255._0_8_ = dVar139 * local_408;
          auVar255._8_8_ = dVar151 * local_408;
          auVar266._0_8_ = dVar353 * local_408;
          auVar266._8_8_ = dVar362 * local_408;
          auVar226._0_8_ = dVar211 * local_408;
          auVar226._8_8_ = dVar239 * local_408;
          auVar310._0_8_ = -dVar245 * local_408;
          auVar310._8_8_ = dVar345 * local_408;
          auVar172 = divpd(auVar310,_DAT_0104f9b0);
          auVar283 = divpd(auVar226,_DAT_0104f9c0);
          auVar146 = divpd(auVar266,_DAT_0104f9d0);
          auVar67 = divpd(auVar255,_DAT_0104f9e0);
          dVar339 = ((((((auVar172._8_8_ + auVar172._0_8_) - auVar283._8_8_) + auVar283._0_8_) -
                      auVar146._8_8_) + auVar146._0_8_) - auVar67._8_8_) + auVar67._0_8_;
        }
        dVar192 = dVar24 * dVar222;
        dVar116 = dVar40 * dVar192;
        dVar339 = dVar339 * p->cam_beta;
        dVar61 = dVar39 * dVar339;
        dVar193 = dVar23 * 0.375;
        dVar62 = (double)(~uVar15 & (ulong)(dVar36 * dVar116 + dVar193 * dVar61));
        pdVar3 = out->vsigma;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar8 = (long)(p->dim).vsigma * sVar10;
          pdVar3[lVar8] = __x * dVar62 + pdVar3[lVar8];
          lVar8 = (long)(p->dim).vsigma * sVar10;
          pdVar3[lVar8 + 1] = pdVar3[lVar8 + 1] + 0.0;
        }
        dVar194 = pdVar2[3] * local_bb0;
        dVar250 = pdVar2[2] * dVar132 + (dVar194 + dVar194) * dVar157;
        dVar63 = pdVar2[4] * dVar319;
        dVar132 = dVar132 * dVar63;
        dVar251 = dVar159 * dVar132 + dVar218 * dVar133 * dVar250;
        dVar195 = dVar220 * dVar251 * 0.25;
        local_3f8 = dVar195;
        if (dVar135 <= 1.35) {
          local_3f8 = 0.0;
        }
        dVar195 = (double)(~uVar12 & (ulong)dVar195);
        dVar280 = dVar195 * dVar44 * dVar47 + dVar216 * dVar195 + dVar298 * dVar195 * dVar47 * 0.5;
        dVar64 = dVar195 + dVar195;
        dVar323 = dVar102 * dVar280 + dVar136 * dVar64 + dVar299 * dVar195;
        if (dVar135 < 1.35) {
          dVar65 = dVar35 * -2.6666666666666665 * dVar323 + dVar195 * -2.6666666666666665 * dVar45;
        }
        else {
          auVar256._0_8_ = dVar55 * local_3f8;
          auVar256._8_8_ = dVar297 * local_3f8;
          auVar267._0_8_ = dVar141 * local_3f8;
          auVar267._8_8_ = dVar152 * local_3f8;
          auVar227._0_8_ = dVar247 * local_3f8;
          auVar227._8_8_ = dVar258 * local_3f8;
          auVar311._0_8_ = -dVar279 * local_3f8;
          auVar311._8_8_ = dVar365 * local_3f8;
          auVar172 = divpd(auVar311,_DAT_0104f9b0);
          auVar283 = divpd(auVar227,_DAT_0104f9c0);
          auVar146 = divpd(auVar267,_DAT_0104f9d0);
          auVar67 = divpd(auVar256,_DAT_0104f9e0);
          dVar65 = ((((((auVar172._8_8_ + auVar172._0_8_) - auVar283._8_8_) + auVar283._0_8_) -
                     auVar146._8_8_) + auVar146._0_8_) - auVar67._8_8_) + auVar67._0_8_;
        }
        dVar142 = dVar24 * dVar251;
        dVar252 = dVar163 * dVar142;
        dVar65 = dVar65 * p->cam_beta;
        dVar143 = dVar103 * dVar65;
        dVar196 = dVar21 * 0.375;
        dVar144 = (double)(~uVar16 & (ulong)(dVar48 * dVar252 + dVar196 * dVar143));
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar8 = (long)(p->dim).vsigma * sVar10;
          pdVar3[lVar8 + 2] = __x * dVar144 + pdVar3[lVar8 + 2];
        }
        dVar145 = 1.0 / (__x * dVar106);
        dVar20 = dVar20 * dVar145;
        dVar20 = dVar20 + dVar20;
        dVar49 = dVar49 + dVar49;
        dVar324 = 0.0;
        if (bVar5 && bVar4) {
          dVar324 = dVar20 - dVar49;
        }
        dVar22 = 1.0 / (dVar22 * dVar22);
        dVar265 = -0.0;
        if (dVar19 < dVar85) {
          dVar265 = (dVar261 * dVar324 + dVar22 * 0.4444444444444444 * dVar343 * dVar343) *
                    0.9847450218426964 * -0.375;
        }
        dVar357 = (dVar123 / dVar180) / (dVar18 * dVar87);
        dVar281 = ((pdVar2[1] / (dVar125 * dVar125)) / dVar125) * -2.0;
        dVar87 = dVar171 * dVar105 * dVar243;
        dVar197 = dVar25 * (dVar108 / dVar127);
        dVar123 = pdVar2[4] * pdVar2[4];
        dVar357 = dVar126 * dVar108 * dVar25 * 9.777777777777779 * (dVar88 / dVar180) +
                  dVar197 * -14.222222222222221 * dVar171 * dVar171 * dVar123 * dVar357 +
                  dVar164 * dVar276 * -5.333333333333333 * dVar87 +
                  dVar164 * dVar164 * dVar90 * dVar281 +
                  (dVar86 * 9.777777777777779 * (dVar88 / dVar180) +
                  dVar154 * 33.77777777777778 * dVar357) * dVar276 * dVar90;
        dVar88 = 1.0 / (dVar27 * dVar27);
        dVar27 = dVar88 * 2.519842099789747;
        dVar88 = dVar88 * 1.4422495703074083;
        dVar154 = 1.0 / (dVar185 * dVar185);
        dVar366 = 1.0 / (dVar26 * dVar185);
        dVar180 = dVar154 * 2.519842099789747;
        dVar185 = dVar244 * dVar93 * 3.141592653589793;
        dVar50 = dVar50 * 1.5874010519681996;
        dVar30 = dVar30 * (((((p->cam_omega / dVar28) / 14.234432706575232) / dVar27) / dVar109) /
                          3.0) * 9.869604401089358 * 1.125;
        dVar125 = dVar88 * dVar30;
        dVar126 = dVar366 * 1.5874010519681996;
        dVar358 = (dVar29 / (dVar85 * dVar85)) / dVar106;
        dVar359 = dVar358 * 1.2599210498948732;
        dVar28 = ((dVar324 * __x + dVar343 + dVar343) * dVar94 * dVar244) / -6.0 +
                 dVar94 * 0.2222222222222222 * dVar359 * dVar344 * dVar344 +
                 dVar110 * dVar357 * dVar51 * 0.25 +
                 dVar165 * dVar165 * dVar126 * dVar51 * -0.5 +
                 dVar180 * dVar165 * dVar165 * dVar125 +
                 (dVar109 * dVar165 * dVar50 * dVar344 * dVar185) / -6.0;
        dVar316 = dVar275 / dVar316;
        dVar86 = 1.0 / (dVar95 * dVar95);
        dVar95 = dVar86 / dVar95;
        dVar324 = ((dVar333 / __x) * dVar26 * dVar40 * dVar23) / 12.0;
        dVar26 = dVar86 * -2.0;
        dVar29 = dVar34 * dVar277 + dVar34 * dVar277;
        local_568 = auVar306._0_8_;
        dStack_560 = auVar306._8_8_;
        if (dVar155 < 1.35) {
          dVar28 = (double)(~uVar17 & (ulong)dVar28);
          dVar282 = local_8a8 * local_8a8;
          dVar340 = dVar28 * -2.6666666666666665 * dVar32 + local_8a8 * -5.333333333333333 * dVar364
          ;
          dVar28 = dVar181 * -2.6666666666666665 *
                   ((dVar28 * dVar31 * dVar34 +
                    dVar212 * dVar28 +
                    ((dVar282 * -4.0 * dVar97 +
                     dVar95 * dVar282 * dVar34 * 0.25 +
                     dVar26 * dVar282 * dVar34 + dVar277 * dVar28 * dVar34 * 0.5) -
                    dVar282 * dVar33 * dVar34)) * dVar96 +
                   local_8a8 * 4.0 * dVar213 +
                   (dVar28 + dVar28) * dVar128 +
                   dVar363 * dVar28 +
                   (dVar29 * dVar282 - dVar282 * (dVar86 / dVar181) * dVar34 * 0.5));
        }
        else {
          dVar282 = dVar331 * dVar331;
          dVar28 = (double)((ulong)dVar28 & uVar17);
          auVar149._0_8_ = dVar296 * dVar282;
          auVar149._8_8_ = dVar239 * dVar28;
          auVar283 = divpd(auVar149,_DAT_0104f9f0);
          auVar312._0_8_ = dVar211 * dVar28;
          auVar312._8_8_ = local_568 * dVar282;
          auVar172 = divpd(auVar312,_DAT_0104fa00);
          auVar69._0_8_ = dStack_560 * dVar282;
          auVar69._8_8_ = dVar362 * dVar28;
          auVar306 = divpd(auVar69,_DAT_0104fa10);
          auVar313._0_8_ = dVar353 * dVar28;
          auVar313._8_8_ = dVar241 * dVar282;
          auVar147 = divpd(auVar313,_DAT_0104fa20);
          auVar201._0_8_ = dVar282 * dVar275;
          auVar201._8_8_ = dVar28 * dVar151;
          auVar67 = divpd(auVar201,_DAT_0104fa30);
          auVar202._0_8_ = dVar139 * dVar28;
          auVar202._8_8_ = dVar316 * dVar282;
          auVar146 = divpd(auVar202,_DAT_0104fa40);
          dVar340 = auVar146._0_8_;
          dVar28 = (((((((((dVar28 * dVar345) / 240.0 +
                           (dVar259 * dVar282) / -48.0 +
                           (dVar245 * dVar28) / -18.0 + (dVar129 * dVar282) / 6.0 + auVar283._0_8_)
                         - auVar283._8_8_) - auVar172._8_8_) + auVar172._0_8_ + auVar306._0_8_) -
                      auVar306._8_8_) - auVar147._8_8_) + auVar147._0_8_ + auVar67._0_8_) -
                   auVar67._8_8_) - auVar146._8_8_;
        }
        dVar170 = dVar23 * dVar246 * dVar334;
        dVar179 = dVar23 * dVar333 * dVar165 * dVar40;
        dVar325 = 0.0;
        dVar282 = 0.0;
        if (dVar66 < dVar18) {
          dVar282 = (dVar28 + dVar340) * p->cam_beta * dVar39 * dVar193 +
                    dVar23 * 0.75 * dVar167 * dVar246 +
                    ((((dVar166 * 0.75 * dVar113 +
                        ((dVar265 * dVar162 + dVar166 * dVar52 * -0.25) - dVar166 * 0.75 * dVar112)
                       + dVar324) - dVar179 * 0.25) + dVar170 * 0.25) -
                    dVar357 * dVar24 * dVar40 * dVar193);
        }
        dVar145 = dVar145 * dVar130;
        dVar145 = dVar145 + dVar145;
        if (bVar5 && bVar4) {
          dVar325 = dVar49 + dVar145;
        }
        dVar28 = 1.0 / (dVar37 * dVar37);
        dVar37 = -0.0;
        if (dVar153 < dVar98) {
          dVar37 = (dVar325 * dVar373 + dVar28 * 0.4444444444444444 * dVar278 * dVar278) *
                   0.9847450218426964 * -0.375;
        }
        dVar130 = ((dVar333 / __x) * dVar160 * dVar163 * dVar21) / 12.0;
        dVar106 = (dVar42 / (dVar98 * dVar98)) / dVar106;
        dVar42 = dVar41 * 0.2222222222222222 * dVar106 * 1.2599210498948732;
        dVar357 = dVar140 * dVar140 * dVar42 +
                  ((dVar325 * __x + dVar278 + dVar278) * dVar214) / -6.0;
        dVar260 = dVar242 / dVar260;
        dVar340 = 1.0 / (dVar101 * dVar101);
        dVar101 = dVar340 / dVar101;
        dVar325 = dVar340 * -2.0;
        dVar265 = dVar47 * dVar298 + dVar47 * dVar298;
        local_6b8 = auVar117._0_8_;
        dStack_6b0 = auVar117._8_8_;
        if (dVar135 < 1.35) {
          dVar357 = (double)(~uVar12 & (ulong)dVar357);
          dVar326 = dVar215 * dVar215;
          dVar367 = dVar357 * -2.6666666666666665 * dVar45 + dVar215 * -5.333333333333333 * dVar355;
          dVar357 = dVar35 * -2.6666666666666665 *
                    ((dVar357 * dVar44 * dVar47 +
                     dVar216 * dVar357 +
                     ((dVar326 * -4.0 * dVar161 +
                      dVar101 * dVar326 * dVar47 * 0.25 +
                      dVar325 * dVar326 * dVar47 + dVar298 * dVar357 * dVar47 * 0.5) -
                     dVar326 * dVar46 * dVar47)) * dVar102 +
                    dVar215 * 4.0 * dVar354 +
                    (dVar357 + dVar357) * dVar136 +
                    dVar299 * dVar357 +
                    (dVar265 * dVar326 - dVar326 * (dVar340 / dVar35) * dVar47 * 0.5));
        }
        else {
          dVar326 = local_618 * local_618;
          dVar357 = (double)((ulong)dVar357 & uVar12);
          auVar369._0_8_ = dVar257 * dVar326;
          auVar369._8_8_ = dVar258 * dVar357;
          auVar172 = divpd(auVar369,_DAT_0104f9f0);
          auVar150._0_8_ = dVar247 * dVar357;
          auVar150._8_8_ = local_6b8 * dVar326;
          auVar306 = divpd(auVar150,_DAT_0104fa00);
          auVar228._0_8_ = dStack_6b0 * dVar326;
          auVar228._8_8_ = dVar152 * dVar357;
          auVar283 = divpd(auVar228,_DAT_0104fa10);
          auVar328._0_8_ = dVar141 * dVar357;
          auVar328._8_8_ = dVar184 * dVar326;
          auVar146 = divpd(auVar328,_DAT_0104fa20);
          auVar314._0_8_ = dVar326 * dVar242;
          auVar314._8_8_ = dVar357 * dVar297;
          auVar67 = divpd(auVar314,_DAT_0104fa30);
          auVar315._0_8_ = dVar55 * dVar357;
          auVar315._8_8_ = dVar260 * dVar326;
          auVar117 = divpd(auVar315,_DAT_0104fa40);
          dVar367 = auVar117._0_8_;
          dVar357 = (((((((((dVar357 * dVar365) / 240.0 +
                            (dVar332 * dVar326) / -48.0 +
                            (dVar279 * dVar357) / -18.0 + (dVar137 * dVar326) / 6.0 + auVar172._0_8_
                           ) - auVar172._8_8_) - auVar306._8_8_) + auVar306._0_8_ + auVar283._0_8_)
                       - auVar283._8_8_) - auVar146._8_8_) + auVar146._0_8_ + auVar67._0_8_) -
                    auVar67._8_8_) - auVar117._8_8_;
        }
        dVar326 = dVar240 * dVar317 * dVar21;
        dVar346 = 0.0;
        if (dVar1 < local_d18) {
          dVar346 = (dVar357 + dVar367) * p->cam_beta * dVar103 * dVar196 +
                    dVar326 * 0.25 +
                    dVar56 * 0.75 * dVar57 + dVar37 * dVar104 + dVar53 * dVar56 * -0.25 + dVar130;
        }
        pdVar3 = out->v2rho2;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar8 = (long)(p->dim).v2rho2 * sVar10;
          pdVar3[lVar8] =
               (dVar282 + dVar346) * __x + local_668 + local_668 + dVar114 + dVar114 + pdVar3[lVar8]
          ;
        }
        dVar37 = 0.0;
        if (bVar5 && bVar4) {
          dVar37 = dVar20;
        }
        dVar357 = -0.0;
        if (dVar19 < dVar85) {
          dVar357 = (dVar22 * dVar58 * 0.4444444444444444 * dVar343 + dVar261 * dVar37) *
                    0.9847450218426964 * -0.375;
        }
        dVar91 = ((dVar37 * __x + dVar343 + dVar58) * dVar244 * dVar94) / -6.0 +
                 dVar94 * 1.2599210498948732 * 0.2222222222222222 * dVar358 * dVar59 * dVar344 +
                 (dVar244 * dVar59 * dVar93 * dVar91 * -6.534776057350833 * dVar110 * dVar165) /
                 12.0;
        dVar343 = dVar34 * dVar209;
        dVar37 = dVar34 * local_8a8;
        dVar110 = dVar97 * local_8a8 * -4.0;
        dVar33 = -dVar33;
        dVar93 = -(dVar86 / dVar181);
        if (dVar155 < 1.35) {
          dVar91 = (double)(~uVar17 & (ulong)dVar91);
          dVar91 = dVar209 * -2.6666666666666665 * dVar364 +
                   local_8a8 * -2.6666666666666665 * dVar249 +
                   dVar91 * -2.6666666666666665 * dVar32 +
                   dVar181 * -2.6666666666666665 *
                   ((dVar91 * dVar31 * dVar34 +
                    dVar212 * dVar91 +
                    local_8a8 * dVar33 * dVar343 +
                    dVar110 * dVar209 +
                    dVar95 * dVar209 * dVar37 * 0.25 +
                    dVar86 * dVar209 * -2.0 * dVar37 + dVar277 * dVar91 * dVar34 * 0.5) * dVar96 +
                   dVar111 * dVar300 +
                   dVar248 * dVar213 +
                   (dVar91 + dVar91) * dVar128 +
                   dVar363 * dVar91 +
                   local_8a8 * dVar209 * dVar29 + local_8a8 * dVar93 * dVar343 * 0.5);
        }
        else {
          dVar91 = (double)((ulong)dVar91 & uVar17);
          auVar268._0_8_ = dVar296 * local_608 * dVar331;
          auVar268._8_8_ = dVar91 * dVar239;
          auVar283 = divpd(auVar268,_DAT_0104f9f0);
          auVar350._0_8_ = dVar91 * dVar211;
          auVar350._8_8_ = local_568 * local_608 * dVar331;
          auVar146 = divpd(auVar350,_DAT_0104fa00);
          auVar269._0_8_ = dStack_560 * local_608 * dVar331;
          auVar269._8_8_ = dVar91 * dVar362;
          auVar67 = divpd(auVar269,_DAT_0104fa10);
          auVar351._0_8_ = dVar91 * dVar353;
          auVar351._8_8_ = dVar241 * local_608 * dVar331;
          auVar172 = divpd(auVar351,_DAT_0104fa20);
          auVar270._0_8_ = dVar275 * local_608 * dVar331;
          auVar270._8_8_ = dVar91 * dVar151;
          auVar117 = divpd(auVar270,_DAT_0104fa30);
          auVar203._0_8_ = dVar91 * dVar139;
          auVar203._8_8_ = dVar316 * local_608 * dVar331;
          auVar306 = divpd(auVar203,_DAT_0104fa40);
          dVar91 = ((((((((((dVar91 * dVar345) / 240.0 +
                            (dVar259 * local_608 * dVar331) / -48.0 +
                            (dVar245 * dVar91) / -18.0 + (dVar129 * local_608 * dVar331) / 6.0 +
                           auVar283._0_8_) - auVar283._8_8_) - auVar146._8_8_) + auVar146._0_8_ +
                        auVar67._0_8_) - auVar67._8_8_) - auVar172._8_8_) + auVar172._0_8_ +
                     auVar117._0_8_) - auVar117._8_8_) - auVar306._8_8_) + auVar306._0_8_;
        }
        dVar358 = 0.0;
        if (bVar5 && bVar4) {
          dVar358 = dVar145;
        }
        dVar282 = -0.0;
        if (dVar153 < dVar98) {
          dVar282 = (dVar335 * dVar28 * 0.4444444444444444 * dVar278 + dVar358 * dVar373) *
                    0.9847450218426964 * -0.375;
        }
        dVar92 = dVar54 * dVar92 * 3.141592653589793 * dVar50;
        dVar54 = dVar219 * dVar302 * dVar92;
        dVar367 = ((dVar358 * __x + dVar278 + dVar335) * dVar214) / -6.0 +
                  dVar41 * 1.2599210498948732 * 0.2222222222222222 * dVar106 * dVar321 * dVar140 +
                  (dVar140 * dVar54) / -12.0;
        dVar106 = dVar47 * dVar122;
        dVar278 = dVar47 * dVar215;
        dVar358 = dVar161 * dVar215 * -4.0;
        dVar46 = -dVar46;
        dVar41 = -(dVar340 / dVar35);
        if (dVar135 < 1.35) {
          dVar367 = (double)(~uVar12 & (ulong)dVar367);
          dVar367 = dVar122 * -2.6666666666666665 * dVar355 +
                    dVar215 * -2.6666666666666665 * dVar356 +
                    dVar367 * -2.6666666666666665 * dVar45 +
                    dVar35 * -2.6666666666666665 *
                    ((dVar367 * dVar44 * dVar47 +
                     dVar216 * dVar367 +
                     dVar215 * dVar46 * dVar106 +
                     dVar358 * dVar122 +
                     dVar101 * dVar122 * dVar278 * 0.25 +
                     dVar340 * dVar122 * -2.0 * dVar278 + dVar298 * dVar367 * dVar47 * 0.5) *
                     dVar102 +
                    dVar217 * dVar375 +
                    dVar221 * dVar354 +
                    (dVar367 + dVar367) * dVar136 +
                    dVar299 * dVar367 +
                    dVar215 * dVar122 * dVar265 + dVar215 * dVar41 * dVar106 * 0.5);
        }
        else {
          dVar367 = (double)((ulong)dVar367 & uVar12);
          auVar70._0_8_ = dVar257 * dVar303 * local_618;
          auVar70._8_8_ = dVar367 * dVar258;
          auVar306 = divpd(auVar70,_DAT_0104f9f0);
          auVar229._0_8_ = dVar367 * dVar247;
          auVar229._8_8_ = local_6b8 * dVar303 * local_618;
          auVar67 = divpd(auVar229,_DAT_0104fa00);
          auVar329._0_8_ = dStack_6b0 * dVar303 * local_618;
          auVar329._8_8_ = dVar367 * dVar152;
          auVar146 = divpd(auVar329,_DAT_0104fa10);
          auVar230._0_8_ = dVar367 * dVar141;
          auVar230._8_8_ = dVar184 * dVar303 * local_618;
          auVar117 = divpd(auVar230,_DAT_0104fa20);
          auVar71._0_8_ = dVar242 * dVar303 * local_618;
          auVar71._8_8_ = dVar367 * dVar297;
          auVar283 = divpd(auVar71,_DAT_0104fa30);
          auVar370._0_8_ = dVar367 * dVar55;
          auVar370._8_8_ = dVar260 * dVar303 * local_618;
          auVar172 = divpd(auVar370,_DAT_0104fa40);
          dVar367 = ((((((((((dVar367 * dVar365) / 240.0 +
                             (dVar332 * dVar303 * local_618) / -48.0 +
                             (dVar279 * dVar367) / -18.0 + (dVar137 * dVar303 * local_618) / 6.0 +
                            auVar306._0_8_) - auVar306._8_8_) - auVar67._8_8_) + auVar67._0_8_ +
                         auVar146._0_8_) - auVar146._8_8_) - auVar117._8_8_) + auVar117._0_8_ +
                      auVar283._0_8_) - auVar283._8_8_) - auVar172._8_8_) + auVar172._0_8_;
        }
        dVar305 = dVar186 * 0.375;
        dVar346 = dVar334 * dVar374 * dVar23;
        dVar368 = dVar21 * dVar338 * dVar240;
        dVar372 = dVar21 * dVar333 * dVar302 * dVar163;
        dVar341 = dVar56 * 0.375;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar8 = (long)(p->dim).v2rho2 * sVar10;
          pdVar3[lVar8 + 1] =
               ((double)(~uVar16 &
                        (ulong)(dVar367 * p->cam_beta * dVar103 * dVar196 +
                               dVar368 * 0.125 +
                               dVar341 * dVar322 +
                               dVar317 * dVar189 * dVar196 +
                               dVar372 * -0.125 +
                               ((dVar326 * 0.125 +
                                dVar53 * dVar56 * -0.125 +
                                dVar57 * dVar188 * 0.375 +
                                dVar282 * dVar104 + dVar53 * dVar188 * -0.125 + dVar130) -
                               dVar341 * dVar304))) +
               (double)(~uVar15 &
                       (ulong)(dVar91 * p->cam_beta * dVar39 * dVar193 +
                              dVar167 * dVar374 * dVar193 +
                              dVar346 * 0.125 +
                              dVar166 * 0.375 * dVar168 +
                              dVar170 * 0.125 +
                              dVar179 * -0.125 +
                              dVar166 * dVar52 * -0.125 +
                              dVar113 * dVar305 +
                              ((dVar357 * dVar162 + dVar52 * dVar186 * -0.125) - dVar112 * dVar305)
                              + dVar324))) * __x + local_668 + dVar114 + dVar115 + dVar169 +
               pdVar3[lVar8 + 1];
        }
        dVar91 = 0.0;
        if (bVar5 && bVar4) {
          dVar91 = dVar20 + dVar49;
        }
        dVar20 = -0.0;
        if (dVar19 < dVar85) {
          dVar20 = (dVar261 * dVar91 + dVar22 * 0.4444444444444444 * dVar58 * dVar58) *
                   0.9847450218426964 * -0.375;
        }
        dVar19 = dVar94 * 0.2222222222222222 * dVar359 * dVar59 * dVar59 +
                 (dVar94 * dVar244 * (dVar91 * __x + dVar58 + dVar58)) / -6.0;
        if (dVar155 < 1.35) {
          dVar19 = (double)(~uVar17 & (ulong)dVar19);
          dVar22 = dVar209 * dVar209;
          dVar19 = dVar181 * -2.6666666666666665 *
                   ((dVar19 * dVar31 * dVar34 +
                    dVar212 * dVar19 +
                    dVar22 * dVar33 * dVar34 +
                    dVar22 * -4.0 * dVar97 +
                    dVar95 * dVar22 * dVar34 * 0.25 +
                    dVar26 * dVar22 * dVar34 + dVar277 * dVar19 * dVar34 * 0.5) * dVar96 +
                   dVar209 * 4.0 * dVar300 +
                   (dVar19 + dVar19) * dVar128 +
                   dVar363 * dVar19 + dVar22 * dVar93 * dVar34 * 0.5 + dVar29 * dVar22) +
                   dVar19 * -2.6666666666666665 * dVar32 + dVar209 * -5.333333333333333 * dVar249;
        }
        else {
          dVar22 = local_608 * local_608;
          dVar19 = (double)((ulong)dVar19 & uVar17);
          auVar72._0_8_ = dVar296 * dVar22;
          auVar72._8_8_ = dVar239 * dVar19;
          auVar306 = divpd(auVar72,_DAT_0104f9f0);
          auVar73._0_8_ = dVar211 * dVar19;
          auVar73._8_8_ = local_568 * dVar22;
          auVar283 = divpd(auVar73,_DAT_0104fa00);
          auVar74._0_8_ = dStack_560 * dVar22;
          auVar74._8_8_ = dVar362 * dVar19;
          auVar67 = divpd(auVar74,_DAT_0104fa10);
          auVar75._0_8_ = dVar353 * dVar19;
          auVar75._8_8_ = dVar241 * dVar22;
          auVar117 = divpd(auVar75,_DAT_0104fa20);
          auVar204._0_8_ = dVar22 * dVar275;
          auVar204._8_8_ = dVar19 * dVar151;
          auVar172 = divpd(auVar204,_DAT_0104fa30);
          auVar76._0_8_ = dVar139 * dVar19;
          auVar76._8_8_ = dVar316 * dVar22;
          auVar146 = divpd(auVar76,_DAT_0104fa40);
          dVar19 = ((((((((((dVar19 * dVar345) / 240.0 +
                            (dVar259 * dVar22) / -48.0 +
                            (dVar245 * dVar19) / -18.0 + (dVar129 * dVar22) / 6.0 + auVar306._0_8_)
                          - auVar306._8_8_) - auVar283._8_8_) + auVar283._0_8_ + auVar67._0_8_) -
                       auVar67._8_8_) - auVar117._8_8_) + auVar117._0_8_ + auVar172._0_8_) -
                    auVar172._8_8_) - auVar146._8_8_) + auVar146._0_8_;
        }
        dVar85 = 0.0;
        dVar22 = 0.0;
        if (dVar66 < dVar18) {
          dVar22 = dVar19 * p->cam_beta * dVar39 * dVar193 +
                   dVar346 * 0.25 +
                   dVar324 + dVar186 * 0.75 * dVar168 + dVar20 * dVar162 + dVar52 * dVar186 * -0.25;
        }
        if (bVar5 && bVar4) {
          dVar85 = dVar145 - dVar49;
        }
        dVar19 = -0.0;
        if (dVar153 < dVar98) {
          dVar19 = (dVar373 * dVar85 + dVar28 * 0.4444444444444444 * dVar335 * dVar335) *
                   0.9847450218426964 * -0.375;
        }
        dVar91 = (dVar156 / dVar210) / (local_d18 * dVar100);
        dVar98 = ((pdVar2[1] / (dVar158 * dVar158)) / dVar158) * -2.0;
        dVar20 = local_bb0 * dVar63 * dVar336;
        dVar153 = dVar159 * (dVar319 / dVar183);
        dVar91 = dVar38 * dVar319 * dVar159 * 9.777777777777779 * (dVar131 / dVar210) +
                 dVar153 * -14.222222222222221 * local_bb0 * local_bb0 * dVar123 * dVar91 +
                 dVar318 * dVar218 * -5.333333333333333 * dVar20 +
                 dVar318 * dVar318 * dVar133 * dVar98 +
                 (dVar99 * 9.777777777777779 * (dVar131 / dVar210) +
                 dVar182 * 33.77777777777778 * dVar91) * dVar218 * dVar133;
        dVar28 = 1.0 / (dVar320 * dVar320);
        dVar52 = 1.0 / (dVar160 * dVar320);
        dVar27 = dVar43 * (((((p->cam_omega / dVar134) / 14.234432706575232) / dVar27) / dVar219) /
                          3.0) * 9.869604401089358 * 1.125;
        dVar94 = dVar88 * dVar27 * dVar28 * 2.519842099789747;
        dVar337 = dVar52 * 1.5874010519681996 * dVar337;
        dVar85 = ((dVar85 * __x + dVar335 + dVar335) * dVar214) / -6.0 +
                 dVar42 * dVar321 * dVar321 +
                 dVar220 * dVar91 * 0.25 +
                 dVar302 * dVar302 * dVar337 * -0.5 +
                 dVar94 * dVar302 * dVar302 + (dVar54 * dVar321) / -6.0;
        if (dVar135 < 1.35) {
          dVar85 = (double)(~uVar12 & (ulong)dVar85);
          dVar38 = dVar122 * dVar122;
          dVar85 = dVar35 * -2.6666666666666665 *
                   ((dVar85 * dVar44 * dVar47 +
                    dVar216 * dVar85 +
                    dVar38 * dVar46 * dVar47 +
                    dVar38 * -4.0 * dVar161 +
                    dVar101 * dVar38 * dVar47 * 0.25 +
                    dVar325 * dVar38 * dVar47 + dVar298 * dVar85 * dVar47 * 0.5) * dVar102 +
                   dVar122 * 4.0 * dVar375 +
                   (dVar85 + dVar85) * dVar136 +
                   dVar299 * dVar85 + dVar38 * dVar41 * dVar47 * 0.5 + dVar265 * dVar38) +
                   dVar85 * -2.6666666666666665 * dVar45 + dVar122 * -5.333333333333333 * dVar356;
        }
        else {
          dVar38 = dVar303 * dVar303;
          dVar85 = (double)((ulong)dVar85 & uVar12);
          auVar231._0_8_ = dVar257 * dVar38;
          auVar231._8_8_ = dVar258 * dVar85;
          auVar306 = divpd(auVar231,_DAT_0104f9f0);
          auVar232._0_8_ = dVar247 * dVar85;
          auVar232._8_8_ = local_6b8 * dVar38;
          auVar283 = divpd(auVar232,_DAT_0104fa00);
          auVar233._0_8_ = dStack_6b0 * dVar38;
          auVar233._8_8_ = dVar152 * dVar85;
          auVar67 = divpd(auVar233,_DAT_0104fa10);
          auVar234._0_8_ = dVar141 * dVar85;
          auVar234._8_8_ = dVar184 * dVar38;
          auVar117 = divpd(auVar234,_DAT_0104fa20);
          auVar271._0_8_ = dVar38 * dVar242;
          auVar271._8_8_ = dVar85 * dVar297;
          auVar172 = divpd(auVar271,_DAT_0104fa30);
          auVar235._0_8_ = dVar55 * dVar85;
          auVar235._8_8_ = dVar260 * dVar38;
          auVar146 = divpd(auVar235,_DAT_0104fa40);
          dVar85 = ((((((((((dVar85 * dVar365) / 240.0 +
                            (dVar332 * dVar38) / -48.0 +
                            (dVar279 * dVar85) / -18.0 + (dVar137 * dVar38) / 6.0 + auVar306._0_8_)
                          - auVar306._8_8_) - auVar283._8_8_) + auVar283._0_8_ + auVar67._0_8_) -
                       auVar67._8_8_) - auVar117._8_8_) + auVar117._0_8_ + auVar172._0_8_) -
                    auVar172._8_8_) - auVar146._8_8_) + auVar146._0_8_;
        }
        dVar38 = 0.0;
        if (dVar1 < local_d18) {
          dVar38 = dVar85 * p->cam_beta * dVar103 * dVar196 +
                   dVar21 * 0.75 * dVar189 * dVar338 +
                   ((((dVar130 +
                      dVar188 * 0.75 * dVar322 +
                      ((dVar19 * dVar104 + dVar53 * dVar188 * -0.25) - dVar304 * dVar188 * 0.75)) -
                     dVar372 * 0.25) + dVar368 * 0.25) - dVar91 * dVar24 * dVar163 * dVar196);
        }
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar8 = (long)(p->dim).v2rho2 * sVar10;
          pdVar3[lVar8 + 2] =
               (dVar22 + dVar38) * __x + dVar115 + dVar115 + dVar169 + dVar169 + pdVar3[lVar8 + 2];
        }
        dVar22 = dVar276 * dVar263;
        dVar171 = dVar25 * -2.6666666666666665 * dVar105 * dVar243 +
                  dVar197 * 5.333333333333333 * dVar107 * dVar123 * dVar171 +
                  dVar164 * dVar276 * dVar89 +
                  dVar22 * -2.6666666666666665 * dVar87 +
                  dVar90 * dVar263 * dVar281 * dVar164 +
                  (pdVar2[2] * -2.6666666666666665 * dVar243 +
                  dVar262 * -10.666666666666666 * dVar107) * dVar90 * dVar276;
        dVar85 = dVar185 * dVar50 * dVar109 * dVar222;
        dVar87 = dVar190 * dVar171 * 0.25 +
                 dVar138 * dVar50 * dVar366 * dVar222 * dVar165 * -0.5 +
                 dVar30 * dVar88 * 2.519842099789747 * dVar154 * dVar222 * dVar165 +
                 (dVar344 * dVar85) / -12.0;
        dVar19 = dVar34 * dVar191;
        dVar86 = dVar86 * dVar191 * -2.0;
        if (dVar155 < 1.35) {
          dVar87 = (double)(~uVar17 & (ulong)dVar87);
          dVar87 = dVar191 * -2.6666666666666665 * dVar364 +
                   local_8a8 * -2.6666666666666665 * dVar376 +
                   dVar87 * -2.6666666666666665 * dVar32 +
                   dVar181 * -2.6666666666666665 *
                   ((dVar87 * dVar31 * dVar34 +
                    dVar212 * dVar87 +
                    local_8a8 * dVar33 * dVar19 +
                    dVar110 * dVar191 +
                    dVar37 * dVar95 * dVar191 * 0.25 +
                    dVar86 * dVar37 + dVar277 * dVar87 * dVar34 * 0.5) * dVar96 +
                   dVar111 * dVar264 +
                   dVar213 * dVar60 +
                   (dVar87 + dVar87) * dVar128 +
                   dVar363 * dVar87 +
                   local_8a8 * dVar191 * dVar29 + local_8a8 * dVar93 * dVar19 * 0.5);
        }
        else {
          dVar87 = (double)((ulong)dVar87 & uVar17);
          auVar287._0_8_ = dVar296 * local_408 * dVar331;
          auVar287._8_8_ = dVar87 * dVar239;
          auVar306 = divpd(auVar287,_DAT_0104f9f0);
          auVar288._0_8_ = dVar87 * dVar211;
          auVar288._8_8_ = local_568 * local_408 * dVar331;
          auVar283 = divpd(auVar288,_DAT_0104fa00);
          auVar289._0_8_ = dStack_560 * local_408 * dVar331;
          auVar289._8_8_ = dVar87 * dVar362;
          auVar67 = divpd(auVar289,_DAT_0104fa10);
          auVar290._0_8_ = dVar87 * dVar353;
          auVar290._8_8_ = dVar241 * local_408 * dVar331;
          auVar117 = divpd(auVar290,_DAT_0104fa20);
          auVar291._0_8_ = dVar275 * local_408 * dVar331;
          auVar291._8_8_ = dVar87 * dVar151;
          auVar146 = divpd(auVar291,_DAT_0104fa30);
          auVar330._0_8_ = dVar87 * dVar139;
          auVar330._8_8_ = dVar316 * local_408 * dVar331;
          auVar172 = divpd(auVar330,_DAT_0104fa40);
          dVar87 = ((((((((((dVar87 * dVar345) / 240.0 +
                            (dVar331 * dVar259 * local_408) / -48.0 +
                            (dVar245 * dVar87) / -18.0 + (dVar331 * dVar129 * local_408) / 6.0 +
                           auVar306._0_8_) - auVar306._8_8_) - auVar283._8_8_) + auVar283._0_8_ +
                        auVar67._0_8_) - auVar67._8_8_) - auVar117._8_8_) + auVar117._0_8_ +
                     auVar146._0_8_) - auVar146._8_8_) - auVar172._8_8_) + auVar172._0_8_;
        }
        dVar30 = dVar333 * dVar222 * dVar40 * dVar23 * 0.125;
        dVar91 = dVar334 * dVar339 * dVar23 * 0.125;
        dVar154 = 0.0;
        if (dVar66 < dVar18) {
          dVar154 = dVar87 * p->cam_beta * dVar39 * dVar193 +
                    dVar167 * dVar339 * dVar193 +
                    dVar166 * 0.375 * dVar61 +
                    dVar246 * dVar192 * dVar193 +
                    ((dVar166 * -0.375 * dVar116 - dVar30) - dVar171 * dVar24 * dVar40 * dVar193) +
                    dVar91;
        }
        pdVar3 = out->v2rhosigma;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar8 = (long)(p->dim).v2rhosigma * sVar10;
          pdVar3[lVar8] = dVar154 * __x + dVar62 + pdVar3[lVar8];
          lVar8 = (long)(p->dim).v2rhosigma * sVar10;
          pdVar3[lVar8 + 1] = pdVar3[lVar8 + 1] + 0.0;
        }
        dVar92 = dVar92 * dVar219 * dVar251;
        dVar154 = (dVar140 * dVar92) / -12.0;
        dVar171 = dVar47 * dVar195;
        dVar87 = dVar340 * dVar195 * -2.0;
        if (dVar135 < 1.35) {
          dVar154 = (double)(~uVar12 & (ulong)dVar154);
          dVar154 = dVar195 * -2.6666666666666665 * dVar355 +
                    dVar215 * -2.6666666666666665 * dVar323 +
                    dVar154 * -2.6666666666666665 * dVar45 +
                    dVar35 * -2.6666666666666665 *
                    ((dVar154 * dVar44 * dVar47 +
                     dVar216 * dVar154 +
                     dVar215 * dVar46 * dVar171 +
                     dVar358 * dVar195 +
                     dVar278 * dVar101 * dVar195 * 0.25 +
                     dVar87 * dVar278 + dVar298 * dVar154 * dVar47 * 0.5) * dVar102 +
                    dVar217 * dVar280 +
                    dVar354 * dVar64 +
                    (dVar154 + dVar154) * dVar136 +
                    dVar299 * dVar154 +
                    dVar215 * dVar195 * dVar265 + dVar215 * dVar41 * dVar171 * 0.5);
        }
        else {
          dVar154 = (double)((ulong)dVar154 & uVar12);
          auVar292._0_8_ = dVar257 * local_3f8 * local_618;
          auVar292._8_8_ = dVar154 * dVar258;
          auVar283 = divpd(auVar292,_DAT_0104f9f0);
          auVar293._0_8_ = dVar154 * dVar247;
          auVar293._8_8_ = local_6b8 * local_3f8 * local_618;
          auVar67 = divpd(auVar293,_DAT_0104fa00);
          auVar352._0_8_ = dStack_6b0 * local_3f8 * local_618;
          auVar352._8_8_ = dVar154 * dVar152;
          auVar146 = divpd(auVar352,_DAT_0104fa10);
          auVar294._0_8_ = dVar154 * dVar141;
          auVar294._8_8_ = dVar184 * local_3f8 * local_618;
          auVar117 = divpd(auVar294,_DAT_0104fa20);
          auVar272._0_8_ = dVar242 * local_3f8 * local_618;
          auVar272._8_8_ = dVar154 * dVar297;
          auVar306 = divpd(auVar272,_DAT_0104fa30);
          auVar371._0_8_ = dVar154 * dVar55;
          auVar371._8_8_ = dVar260 * local_3f8 * local_618;
          auVar172 = divpd(auVar371,_DAT_0104fa40);
          dVar154 = ((((((((((dVar154 * dVar365) / 240.0 +
                             (local_618 * dVar332 * local_3f8) / -48.0 +
                             (dVar279 * dVar154) / -18.0 + (local_618 * dVar137 * local_3f8) / 6.0 +
                            auVar283._0_8_) - auVar283._8_8_) - auVar67._8_8_) + auVar67._0_8_ +
                         auVar146._0_8_) - auVar146._8_8_) - auVar117._8_8_) + auVar117._0_8_ +
                      auVar306._0_8_) - auVar306._8_8_) - auVar172._8_8_) + auVar172._0_8_;
        }
        dVar331 = dVar333 * dVar251 * dVar163 * dVar21 * 0.125;
        dVar240 = dVar240 * dVar65 * dVar21 * 0.125;
        dVar37 = 0.0;
        if (dVar1 < local_d18) {
          dVar37 = dVar154 * p->cam_beta * dVar103 * dVar196 +
                   dVar341 * dVar143 +
                   dVar317 * dVar142 * dVar196 + (dVar56 * -0.375 * dVar252 - dVar331) + dVar240;
        }
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar8 = (long)(p->dim).v2rhosigma * sVar10;
          pdVar3[lVar8 + 2] = dVar37 * __x + dVar144 + pdVar3[lVar8 + 2];
        }
        dVar59 = (dVar59 * dVar85) / -12.0;
        if (dVar155 < 1.35) {
          dVar59 = (double)(~uVar17 & (ulong)dVar59);
          dVar19 = dVar191 * -2.6666666666666665 * dVar249 +
                   dVar209 * -2.6666666666666665 * dVar376 +
                   dVar59 * -2.6666666666666665 * dVar32 +
                   dVar181 * -2.6666666666666665 *
                   ((dVar59 * dVar31 * dVar34 +
                    dVar212 * dVar59 +
                    dVar209 * dVar33 * dVar19 +
                    dVar97 * dVar209 * -4.0 * dVar191 +
                    dVar95 * dVar191 * dVar343 * 0.25 +
                    dVar86 * dVar343 + dVar277 * dVar59 * dVar34 * 0.5) * dVar96 +
                   dVar248 * dVar264 +
                   dVar60 * dVar300 +
                   (dVar59 + dVar59) * dVar128 +
                   dVar363 * dVar59 + dVar209 * dVar191 * dVar29 + dVar209 * dVar93 * dVar19 * 0.5);
        }
        else {
          dVar59 = (double)((ulong)dVar59 & uVar17);
          auVar77._0_8_ = dVar296 * local_408 * local_608;
          auVar77._8_8_ = dVar59 * dVar239;
          auVar306 = divpd(auVar77,_DAT_0104f9f0);
          auVar205._0_8_ = dVar59 * dVar211;
          auVar205._8_8_ = local_568 * local_408 * local_608;
          auVar67 = divpd(auVar205,_DAT_0104fa00);
          auVar78._0_8_ = dStack_560 * local_408 * local_608;
          auVar78._8_8_ = dVar59 * dVar362;
          auVar283 = divpd(auVar78,_DAT_0104fa10);
          auVar206._0_8_ = dVar59 * dVar353;
          auVar206._8_8_ = dVar241 * local_408 * local_608;
          auVar117 = divpd(auVar206,_DAT_0104fa20);
          auVar236._0_8_ = dVar275 * local_408 * local_608;
          auVar236._8_8_ = dVar59 * dVar151;
          auVar146 = divpd(auVar236,_DAT_0104fa30);
          auVar273._0_8_ = dVar59 * dVar139;
          auVar273._8_8_ = dVar316 * local_408 * local_608;
          auVar172 = divpd(auVar273,_DAT_0104fa40);
          dVar19 = ((((((((((dVar59 * dVar345) / 240.0 +
                            (dVar259 * local_408 * local_608) / -48.0 +
                            (dVar245 * dVar59) / -18.0 + (dVar129 * local_408 * local_608) / 6.0 +
                           auVar306._0_8_) - auVar306._8_8_) - auVar67._8_8_) + auVar67._0_8_ +
                        auVar283._0_8_) - auVar283._8_8_) - auVar117._8_8_) + auVar117._0_8_ +
                     auVar146._0_8_) - auVar146._8_8_) - auVar172._8_8_) + auVar172._0_8_;
        }
        dVar59 = 0.0;
        if (dVar66 < dVar18) {
          dVar59 = dVar19 * p->cam_beta * dVar39 * dVar193 +
                   dVar305 * dVar61 +
                   dVar374 * dVar192 * dVar193 + (dVar186 * -0.375 * dVar116 - dVar30) + dVar91;
        }
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar8 = (long)(p->dim).v2rhosigma * sVar10;
          pdVar3[lVar8 + 3] = dVar59 * __x + dVar62 + pdVar3[lVar8 + 3];
          lVar8 = (long)(p->dim).v2rhosigma * sVar10;
          pdVar3[lVar8 + 4] = pdVar3[lVar8 + 4] + 0.0;
        }
        dVar85 = dVar218 * dVar250;
        dVar19 = dVar159 * -2.6666666666666665 * dVar63 * dVar336 +
                 dVar153 * 5.333333333333333 * dVar301 * dVar123 * local_bb0 +
                 dVar318 * dVar218 * dVar132 +
                 dVar85 * -2.6666666666666665 * dVar20 +
                 dVar133 * dVar250 * dVar98 * dVar318 +
                 (pdVar2[2] * -2.6666666666666665 * dVar336 +
                 dVar194 * -10.666666666666666 * dVar301) * dVar133 * dVar218;
        dVar59 = dVar220 * dVar19 * 0.25 +
                 dVar50 * dVar187 * dVar52 * dVar251 * dVar302 * -0.5 +
                 dVar88 * 2.519842099789747 * dVar27 * dVar28 * dVar251 * dVar302 +
                 (dVar321 * dVar92) / -12.0;
        if (dVar135 < 1.35) {
          dVar59 = (double)(~uVar12 & (ulong)dVar59);
          dVar171 = dVar195 * -2.6666666666666665 * dVar356 +
                    dVar122 * -2.6666666666666665 * dVar323 +
                    dVar59 * -2.6666666666666665 * dVar45 +
                    dVar35 * -2.6666666666666665 *
                    ((dVar59 * dVar44 * dVar47 +
                     dVar216 * dVar59 +
                     dVar122 * dVar46 * dVar171 +
                     dVar161 * dVar122 * -4.0 * dVar195 +
                     dVar101 * dVar195 * dVar106 * 0.25 +
                     dVar87 * dVar106 + dVar298 * dVar59 * dVar47 * 0.5) * dVar102 +
                    dVar221 * dVar280 +
                    dVar64 * dVar375 +
                    (dVar59 + dVar59) * dVar136 +
                    dVar299 * dVar59 +
                    dVar122 * dVar195 * dVar265 + dVar122 * dVar41 * dVar171 * 0.5);
        }
        else {
          dVar59 = (double)((ulong)dVar59 & uVar12);
          auVar79._0_8_ = dVar257 * local_3f8 * dVar303;
          auVar79._8_8_ = dVar59 * dVar258;
          auVar306 = divpd(auVar79,_DAT_0104f9f0);
          auVar237._0_8_ = dVar59 * dVar247;
          auVar237._8_8_ = local_6b8 * local_3f8 * dVar303;
          auVar117 = divpd(auVar237,_DAT_0104fa00);
          auVar80._0_8_ = dStack_6b0 * local_3f8 * dVar303;
          auVar80._8_8_ = dVar59 * dVar152;
          auVar283 = divpd(auVar80,_DAT_0104fa10);
          auVar238._0_8_ = dVar59 * dVar141;
          auVar238._8_8_ = dVar184 * local_3f8 * dVar303;
          auVar146 = divpd(auVar238,_DAT_0104fa20);
          auVar274._0_8_ = dVar242 * local_3f8 * dVar303;
          auVar274._8_8_ = dVar59 * dVar297;
          auVar172 = divpd(auVar274,_DAT_0104fa30);
          auVar207._0_8_ = dVar59 * dVar55;
          auVar207._8_8_ = dVar260 * local_3f8 * dVar303;
          auVar67 = divpd(auVar207,_DAT_0104fa40);
          dVar171 = ((((((((((dVar59 * dVar365) / 240.0 +
                             (dVar332 * local_3f8 * dVar303) / -48.0 +
                             (dVar279 * dVar59) / -18.0 + (dVar137 * local_3f8 * dVar303) / 6.0 +
                            auVar306._0_8_) - auVar306._8_8_) - auVar117._8_8_) + auVar117._0_8_ +
                         auVar283._0_8_) - auVar283._8_8_) - auVar146._8_8_) + auVar146._0_8_ +
                      auVar172._0_8_) - auVar172._8_8_) - auVar67._8_8_) + auVar67._0_8_;
        }
        dVar59 = 0.0;
        if (dVar1 < local_d18) {
          dVar59 = dVar171 * p->cam_beta * dVar103 * dVar196 +
                   dVar189 * dVar65 * dVar196 +
                   dVar240 + dVar188 * 0.375 * dVar143 +
                             dVar338 * dVar142 * dVar196 +
                             ((dVar188 * -0.375 * dVar252 - dVar331) -
                             dVar19 * dVar24 * dVar163 * dVar196);
        }
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar8 = (long)(p->dim).v2rhosigma * sVar10;
          pdVar3[lVar8 + 5] = dVar59 * __x + dVar144 + pdVar3[lVar8 + 5];
        }
        dVar171 = dVar25 * -2.0 * (dVar108 / dVar127) * dVar123 * dVar124 +
                  (dVar276 + dVar276) * pdVar2[3] * dVar124 * dVar90 +
                  (dVar22 + dVar22) * dVar89 + dVar263 * dVar263 * dVar90 * dVar281;
        dVar19 = dVar190 * dVar171 * 0.25 +
                 dVar180 * dVar125 * dVar222 * dVar222 + dVar126 * dVar51 * dVar222 * dVar222 * -0.5
        ;
        if (dVar155 < 1.35) {
          dVar19 = (double)(~uVar17 & (ulong)dVar19);
          dVar59 = dVar191 * dVar191;
          dVar19 = dVar181 * -2.6666666666666665 *
                   (dVar96 * (dVar31 * dVar19 * dVar34 +
                             dVar212 * dVar19 +
                             dVar33 * dVar59 * dVar34 +
                             dVar59 * -4.0 * dVar97 +
                             dVar95 * dVar59 * dVar34 * 0.25 +
                             dVar26 * dVar59 * dVar34 + dVar277 * dVar19 * dVar34 * 0.5) +
                   dVar191 * 4.0 * dVar264 +
                   (dVar19 + dVar19) * dVar128 +
                   dVar363 * dVar19 + dVar29 * dVar59 + dVar93 * dVar59 * dVar34 * 0.5) +
                   dVar19 * -2.6666666666666665 * dVar32 + dVar191 * -5.333333333333333 * dVar376;
        }
        else {
          dVar19 = (double)(uVar17 & (ulong)dVar19);
          local_408 = local_408 * local_408;
          auVar295._0_8_ = dVar296 * local_408;
          auVar295._8_8_ = dVar239 * dVar19;
          auVar146 = divpd(auVar295,_DAT_0104f9f0);
          auVar81._0_8_ = dVar211 * dVar19;
          auVar81._8_8_ = local_568 * local_408;
          auVar306 = divpd(auVar81,_DAT_0104fa00);
          auVar342._0_8_ = dStack_560 * local_408;
          auVar342._8_8_ = dVar362 * dVar19;
          auVar172 = divpd(auVar342,_DAT_0104fa10);
          auVar82._0_8_ = dVar353 * dVar19;
          auVar82._8_8_ = dVar241 * local_408;
          auVar283 = divpd(auVar82,_DAT_0104fa20);
          auVar83._0_8_ = dVar275 * local_408;
          auVar83._8_8_ = dVar151 * dVar19;
          auVar67 = divpd(auVar83,_DAT_0104fa30);
          auVar84._0_8_ = dVar139 * dVar19;
          auVar84._8_8_ = dVar316 * local_408;
          auVar117 = divpd(auVar84,_DAT_0104fa40);
          dVar19 = ((((((((((dVar345 * dVar19) / 240.0 +
                            (dVar259 * local_408) / -48.0 +
                            (dVar245 * dVar19) / -18.0 + (dVar129 * local_408) / 6.0 +
                           auVar146._0_8_) - auVar146._8_8_) - auVar306._8_8_) + auVar306._0_8_ +
                        auVar172._0_8_) - auVar172._8_8_) - auVar283._8_8_) + auVar283._0_8_ +
                     auVar67._0_8_) - auVar67._8_8_) - auVar117._8_8_) + auVar117._0_8_;
        }
        dVar59 = 0.0;
        if (dVar66 < dVar18) {
          dVar59 = dVar193 * dVar39 * dVar19 * p->cam_beta +
                   dVar36 * dVar40 * dVar171 * dVar24 + dVar23 * 0.75 * dVar192 * dVar339;
        }
        pdVar3 = out->v2sigma2;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar8 = (long)(p->dim).v2sigma2 * sVar10;
          pdVar3[lVar8] = dVar59 * __x + pdVar3[lVar8];
          lVar8 = (long)(p->dim).v2sigma2 * sVar10;
          pdVar3[lVar8 + 1] = pdVar3[lVar8 + 1] + 0.0;
          lVar8 = (long)(p->dim).v2sigma2 * sVar10;
          pdVar3[lVar8 + 2] = pdVar3[lVar8 + 2] + 0.0;
          lVar8 = (long)(p->dim).v2sigma2 * sVar10;
          pdVar3[lVar8 + 3] = pdVar3[lVar8 + 3] + 0.0;
          lVar8 = (long)(p->dim).v2sigma2 * sVar10;
          pdVar3[lVar8 + 4] = pdVar3[lVar8 + 4] + 0.0;
        }
        dVar18 = (dVar218 + dVar218) * pdVar2[3] * dVar157 * dVar133 +
                 (dVar85 + dVar85) * dVar132 +
                 dVar98 * dVar250 * dVar250 * dVar133 +
                 dVar159 * -2.0 * (dVar319 / dVar183) * dVar123 * dVar157;
        dVar66 = dVar220 * dVar18 * 0.25 +
                 dVar94 * dVar251 * dVar251 + dVar337 * dVar251 * dVar251 * -0.5;
        if (dVar135 < 1.35) {
          dVar66 = (double)(~uVar12 & (ulong)dVar66);
          dVar171 = dVar195 * dVar195;
          dVar66 = dVar35 * -2.6666666666666665 *
                   (dVar102 * (dVar44 * dVar66 * dVar47 +
                              dVar216 * dVar66 +
                              dVar46 * dVar171 * dVar47 +
                              dVar171 * -4.0 * dVar161 +
                              dVar101 * dVar171 * dVar47 * 0.25 +
                              dVar325 * dVar171 * dVar47 + dVar298 * dVar66 * dVar47 * 0.5) +
                   dVar195 * 4.0 * dVar280 +
                   (dVar66 + dVar66) * dVar136 +
                   dVar299 * dVar66 + dVar265 * dVar171 + dVar41 * dVar171 * dVar47 * 0.5) +
                   dVar66 * -2.6666666666666665 * dVar45 + dVar195 * -5.333333333333333 * dVar323;
        }
        else {
          dVar66 = (double)(uVar12 & (ulong)dVar66);
          local_3f8 = local_3f8 * local_3f8;
          auVar208._0_8_ = dVar257 * local_3f8;
          auVar208._8_8_ = dVar258 * dVar66;
          auVar172 = divpd(auVar208,_DAT_0104f9f0);
          auVar177._0_8_ = dVar247 * dVar66;
          auVar177._8_8_ = local_6b8 * local_3f8;
          auVar117 = divpd(auVar177,_DAT_0104fa00);
          auVar119._0_8_ = dStack_6b0 * local_3f8;
          auVar119._8_8_ = dVar152 * dVar66;
          auVar306 = divpd(auVar119,_DAT_0104fa10);
          auVar178._0_8_ = dVar141 * dVar66;
          auVar178._8_8_ = dVar184 * local_3f8;
          auVar146 = divpd(auVar178,_DAT_0104fa20);
          auVar120._0_8_ = dVar242 * local_3f8;
          auVar120._8_8_ = dVar297 * dVar66;
          auVar283 = divpd(auVar120,_DAT_0104fa30);
          auVar121._0_8_ = dVar55 * dVar66;
          auVar121._8_8_ = dVar260 * local_3f8;
          auVar67 = divpd(auVar121,_DAT_0104fa40);
          dVar66 = ((((((((((dVar365 * dVar66) / 240.0 +
                            (dVar332 * local_3f8) / -48.0 +
                            (dVar279 * dVar66) / -18.0 + (dVar137 * local_3f8) / 6.0 +
                           auVar172._0_8_) - auVar172._8_8_) - auVar117._8_8_) + auVar117._0_8_ +
                        auVar306._0_8_) - auVar306._8_8_) - auVar146._8_8_) + auVar146._0_8_ +
                     auVar283._0_8_) - auVar283._8_8_) - auVar67._8_8_) + auVar67._0_8_;
        }
        dVar171 = 0.0;
        if (dVar1 < local_d18) {
          dVar171 = dVar196 * dVar103 * dVar66 * p->cam_beta +
                    dVar48 * dVar163 * dVar24 * dVar18 + dVar21 * 0.75 * dVar142 * dVar65;
        }
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar8 = (long)(p->dim).v2sigma2 * sVar10;
          pdVar3[lVar8 + 5] = __x * dVar171 + pdVar3[lVar8 + 5];
        }
      }
      sVar10 = sVar10 + 1;
    } while (np != sVar10);
  }
  return;
}

Assistant:

static void
WORK_GGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, const double *sigma,
         xc_gga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};
  double my_sigma[3] = {0.0, 0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));
    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, out);
    
    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 %le 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(sigma, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le %le %le %le 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1),
                 VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2));
        }
      }
    }
#endif
  }   /* for(ip) */

}